

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_colorspace_check_gamma
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_fixed_point gAMA,int from)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RAX;
  uint uVar3;
  char *message;
  png_fixed_point gtest;
  
  gtest = (png_fixed_point)((ulong)in_RAX >> 0x20);
  uVar1 = colorspace->flags;
  uVar3 = 1;
  if ((uVar1 & 1) != 0) {
    iVar2 = png_muldiv(&gtest,colorspace->gamma,100000,gAMA);
    if ((iVar2 == 0) || (10000 < gtest - 95000U)) {
      if (from == 2 || (uVar1 & 0x20) != 0) {
        uVar3 = (uint)(from == 2);
        message = "gamma value does not match sRGB";
        iVar2 = 2;
      }
      else {
        message = "gamma value does not match libpng estimate";
        iVar2 = 0;
      }
      png_chunk_report(png_ptr,message,iVar2);
    }
  }
  return uVar3;
}

Assistant:

static int
png_colorspace_check_gamma(png_const_structrp png_ptr,
    png_colorspacerp colorspace, png_fixed_point gAMA, int from)
   /* This is called to check a new gamma value against an existing one.  The
    * routine returns false if the new gamma value should not be written.
    *
    * 'from' says where the new gamma value comes from:
    *
    *    0: the new gamma value is the libpng estimate for an ICC profile
    *    1: the new gamma value comes from a gAMA chunk
    *    2: the new gamma value comes from an sRGB chunk
    */
{
   png_fixed_point gtest;

   if ((colorspace->flags & PNG_COLORSPACE_HAVE_GAMMA) != 0 &&
       (png_muldiv(&gtest, colorspace->gamma, PNG_FP_1, gAMA) == 0  ||
      png_gamma_significant(gtest) != 0))
   {
      /* Either this is an sRGB image, in which case the calculated gamma
       * approximation should match, or this is an image with a profile and the
       * value libpng calculates for the gamma of the profile does not match the
       * value recorded in the file.  The former, sRGB, case is an error, the
       * latter is just a warning.
       */
      if ((colorspace->flags & PNG_COLORSPACE_FROM_sRGB) != 0 || from == 2)
      {
         png_chunk_report(png_ptr, "gamma value does not match sRGB",
             PNG_CHUNK_ERROR);
         /* Do not overwrite an sRGB value */
         return from == 2;
      }

      else /* sRGB tag not involved */
      {
         png_chunk_report(png_ptr, "gamma value does not match libpng estimate",
             PNG_CHUNK_WARNING);
         return from == 1;
      }
   }

   return 1;
}